

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

char __thiscall Fl_Preferences::Node::deleteEntry(Node *this,char *name)

{
  int iVar1;
  int ix;
  char *name_local;
  Node *this_local;
  
  iVar1 = getEntry(this,name);
  if (iVar1 != -1) {
    memmove(this->entry_ + iVar1,this->entry_ + (long)iVar1 + 1,
            (long)((this->nEntry_ - iVar1) + -1) << 4);
    this->nEntry_ = this->nEntry_ + -1;
    this->field_0x30 = this->field_0x30 & 0xfe | 1;
  }
  return iVar1 != -1;
}

Assistant:

char Fl_Preferences::Node::deleteEntry( const char *name ) {
  int ix = getEntry( name );
  if ( ix == -1 ) return 0;
  memmove( entry_+ix, entry_+ix+1, (nEntry_-ix-1) * sizeof(Entry) );
  nEntry_--;
  dirty_ = 1;
  return 1;
}